

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::TiledInputFile::TiledInputFile
          (TiledInputFile *this,Header *header,IStream *is,int version,int numThreads)

{
  Data **ppDVar1;
  int iVar2;
  Data *pDVar3;
  InputStreamMutex *pIVar4;
  undefined4 extraout_var;
  
  GenericInputFile::GenericInputFile(&this->super_GenericInputFile);
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__TiledInputFile_0036b890;
  pDVar3 = (Data *)operator_new(0x180);
  Data::Data(pDVar3,numThreads);
  ppDVar1 = &this->_data;
  *ppDVar1 = pDVar3;
  pDVar3->_deleteStream = false;
  pIVar4 = (InputStreamMutex *)operator_new(0x38);
  (pIVar4->super_Mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  pIVar4->is = (IStream *)0x0;
  *(undefined8 *)((long)&(pIVar4->super_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (pIVar4->super_Mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (pIVar4->super_Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pIVar4->super_Mutex).super___mutex_base._M_mutex + 8) = 0;
  pIVar4->currentPosition = 0;
  pDVar3->_streamData = pIVar4;
  pIVar4->is = is;
  Header::operator=(&pDVar3->header,header);
  this->_data->version = version;
  initialize(this);
  pDVar3 = *ppDVar1;
  TileOffsets::readFrom
            (&pDVar3->tileOffsets,pDVar3->_streamData->is,&pDVar3->fileIsComplete,false,false);
  iVar2 = (*is->_vptr_IStream[2])(is);
  pDVar3 = *ppDVar1;
  pDVar3->memoryMapped = SUB41(iVar2,0);
  iVar2 = (*pDVar3->_streamData->is->_vptr_IStream[5])();
  (*ppDVar1)->_streamData->currentPosition = CONCAT44(extraout_var,iVar2);
  return;
}

Assistant:

TiledInputFile::TiledInputFile (const Header &header,
                                OPENEXR_IMF_INTERNAL_NAMESPACE::IStream *is,
                                int version,
                                int numThreads) :
    _data (new Data (numThreads))
{
    _data->_deleteStream=false;
    _data->_streamData = new InputStreamMutex();
    //
    // This constructor called by class Imf::InputFile
    // when a user wants to just read an image file, and
    // doesn't care or know if the file is tiled.
    // No need to have backward compatibility here, because
    // we have somehow got the header.
    //

    try
    {
        _data->_streamData->is = is;
        _data->header = header;
        _data->version = version;
        initialize();
        _data->tileOffsets.readFrom (*(_data->_streamData->is),_data->fileIsComplete,false,false);
        _data->memoryMapped = is->isMemoryMapped();
        _data->_streamData->currentPosition = _data->_streamData->is->tellg();
    }
    catch(...)
    {
        if (!_data->memoryMapped)
        {
            for (size_t i = 0; i < _data->tileBuffers.size(); i++)
            {
                if(_data->tileBuffers[i])
                {
                     delete [] _data->tileBuffers[i]->buffer;
                }
            }
        }
        delete _data->_streamData;
        delete _data;
        throw; 
    }
}